

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::RepeatedClearCase::render
          (RepeatedClearCase *this,Context *ctx,Surface *dst)

{
  deUint32 program;
  GLenum reason;
  FboIncompleteException *this_00;
  ulong uVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  deUint32 textures [2];
  deUint32 fbos [2];
  Vec3 local_1b8;
  Vec3 local_1a8;
  Random rnd;
  SingleTex2DShader fboBlitShader;
  
  SingleTex2DShader::SingleTex2DShader(&fboBlitShader);
  program = (*ctx->_vptr_Context[0x75])(ctx,&fboBlitShader);
  deRandom_init(&rnd.m_rnd,0x1153f3e);
  fbos[0] = 0;
  fbos[1] = 0;
  textures[0] = 0;
  textures[1] = 0;
  (*ctx->_vptr_Context[10])(ctx,2);
  (*ctx->_vptr_Context[7])(ctx,2,textures);
  lVar3 = 0;
  do {
    if (lVar3 == 8) {
      (*ctx->_vptr_Context[0x2a])(0,0,0,0,ctx);
      (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
      SingleTex2DShader::setUnit(&fboBlitShader,ctx,program,0);
      (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)textures & 0xffffffff);
      for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
        for (uVar1 = 0; (int)uVar1 != 0x40; uVar1 = (ulong)((int)uVar1 + 0x10)) {
          fVar4 = deRandom_getFloat(&rnd.m_rnd);
          fVar5 = deRandom_getFloat(&rnd.m_rnd);
          fVar6 = deRandom_getFloat(&rnd.m_rnd);
          fVar7 = deRandom_getFloat(&rnd.m_rnd);
          (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbos & 0xffffffff);
          (*ctx->_vptr_Context[0x2a])((ulong)(uint)fVar4,fVar5,fVar6,fVar7,ctx);
          (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
          (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbos >> 0x20);
          (*ctx->_vptr_Context[5])(ctx,uVar1,(ulong)(uint)(iVar2 << 4),0x10,0x10);
          local_1a8.m_data[0] = -1.0;
          local_1a8.m_data[1] = -1.0;
          local_1a8.m_data[2] = 0.0;
          local_1b8.m_data[0] = 1.0;
          local_1b8.m_data[1] = 1.0;
          local_1b8.m_data[2] = 0.0;
          sglr::drawQuad(ctx,program,&local_1a8,&local_1b8);
        }
      }
      (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,0x40,0x40);
      sglr::ShaderProgram::~ShaderProgram(&fboBlitShader.super_ShaderProgram);
      return;
    }
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)*(uint *)((long)textures + lVar3));
    uVar1 = (ulong)(this->super_FboRenderCase).m_config.colorbufferFormat;
    (*ctx->_vptr_Context[0x11])
              (ctx,0xde1,0,uVar1,(ulong)*(uint *)((long)&DAT_005d2fd8 + lVar3),
               (ulong)*(uint *)((long)&DAT_005d2fd8 + lVar3),0,uVar1,0x1401,0);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2802,0x812f);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2803,0x812f);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)*(uint *)((long)fbos + lVar3));
    (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8ce0,0xde1,(ulong)*(uint *)((long)textures + lVar3),0);
    reason = (*ctx->_vptr_Context[0x21])(ctx,0x8d40);
    lVar3 = lVar3 + 4;
  } while (reason == 0x8cd5);
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x50);
  FboIncompleteException::FboIncompleteException
            (this_00,&(this->super_FboRenderCase).m_config,reason,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFboRenderTest.cpp"
             ,0x7ea);
  __cxa_throw(this_00,&FboIncompleteException::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void render (sglr::Context& ctx, Surface& dst)
	{
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		SingleTex2DShader				fboBlitShader;
		const deUint32					fboBlitShaderID	= ctx.createProgram(&fboBlitShader);

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		ctx.genFramebuffers(2, &fbos[0]);
		ctx.genTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			ctx.bindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			ctx.texImage2D(GL_TEXTURE_2D, 0, getConfig().colorbufferFormat, fboSizes[fboNdx], fboSizes[fboNdx], 0,
						   getConfig().colorbufferFormat, GL_UNSIGNED_BYTE, DE_NULL);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			ctx.texParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);

			{
				const GLenum status = ctx.checkFramebufferStatus(GL_FRAMEBUFFER);
				if (status != GL_FRAMEBUFFER_COMPLETE)
					throw FboIncompleteException(getConfig(), status, __FILE__, __LINE__);
			}
		}

		// larger fbo bound -- clear to transparent black
		ctx.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		ctx.clear(GL_COLOR_BUFFER_BIT);

		fboBlitShader.setUnit(ctx, fboBlitShaderID, 0);
		ctx.bindTexture(GL_TEXTURE_2D, textures[0]);

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const float	r	= rnd.getFloat();
			const float	g	= rnd.getFloat();
			const float	b	= rnd.getFloat();
			const float	a	= rnd.getFloat();

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			ctx.clearColor(r, g, b, a);
			ctx.clear(GL_COLOR_BUFFER_BIT);

			ctx.bindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
			ctx.viewport(cellX*cellSize, cellY*cellSize, cellSize, cellSize);
			sglr::drawQuad(ctx, fboBlitShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		ctx.readPixels(dst, 0, 0, fboSizes[1], fboSizes[1]);
	}